

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

int parse_args_DEFB(Context_conflict2 *ctx)

{
  Token TVar1;
  int iVar2;
  uint32 uVar3;
  
  parse_destination_token(ctx);
  require_comma(ctx);
  TVar1 = nexttoken(ctx);
  if (TVar1 == TOKEN_IDENTIFIER) {
    iVar2 = check_token_segment(ctx,"true");
    if (iVar2 == 0) {
      iVar2 = check_token_segment(ctx,"false");
      uVar3 = 0;
      if (iVar2 == 0) goto LAB_00137906;
    }
    else {
      uVar3 = 1;
    }
    iVar2 = ctx->tokenbufpos;
    ctx->tokenbufpos = iVar2 + 1;
    ctx->tokenbuf[iVar2] = uVar3;
    if (ctx->tokenlen == 0) {
      return 3;
    }
  }
LAB_00137906:
  fail(ctx,"Expected \'true\' or \'false\'");
  return 3;
}

Assistant:

static int parse_args_DEFB(Context *ctx)
{
    parse_destination_token(ctx);
    require_comma(ctx);

    // !!! FIXME: do a TOKEN_TRUE and TOKEN_FALSE? Is this case-sensitive?
    const Token token = nexttoken(ctx);

    int bad = 0;
    if (token != TOKEN_IDENTIFIER)
        bad = 1;
    else if (check_token_segment(ctx, "true"))
        ctx->tokenbuf[ctx->tokenbufpos++] = 1;
    else if (check_token_segment(ctx, "false"))
        ctx->tokenbuf[ctx->tokenbufpos++] = 0;
    else
        bad = 1;

    if (ctx->tokenlen != 0)
        bad = 1;

    if (bad)
        fail(ctx, "Expected 'true' or 'false'");

    return 3;
}